

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

DrawStyle * __thiscall CMU462::DynamicScene::Skeleton::get_draw_style(Skeleton *this,Joint *joint)

{
  Joint *joint_local;
  Skeleton *this_local;
  
  if (((this->super_SceneObject).scene == (Scene *)0x0) ||
     (joint != (Joint *)(((this->super_SceneObject).scene)->selected).object)) {
    if (((this->super_SceneObject).scene == (Scene *)0x0) ||
       (joint != (Joint *)(((this->super_SceneObject).scene)->hovered).object)) {
      this_local = (Skeleton *)this->defaultStyle;
    }
    else {
      this_local = (Skeleton *)this->hoveredStyle;
    }
  }
  else {
    this_local = (Skeleton *)this->selectedStyle;
  }
  return (DrawStyle *)this_local;
}

Assistant:

DrawStyle *Skeleton::get_draw_style(Joint* joint) const
  {
    if (scene && joint == scene->selected.object)
    {
      return selectedStyle;
    }

    if (scene && joint == scene->hovered.object)
    {
      return hoveredStyle;
    }

    return defaultStyle;
  }